

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
gl4cts::EnhancedLayouts::Utils::Type::GenerateDataPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Type *this)

{
  pointer puVar1;
  GLdouble GVar2;
  GLuint GVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  GLfloat GVar8;
  
  GVar3 = GetTypeSize(this->m_basic_type);
  uVar6 = this->m_n_rows * this->m_n_columns;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,(ulong)(GVar3 * uVar6));
  if (this->m_basic_type < 4) {
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    switch(this->m_basic_type) {
    case Float:
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        GVar8 = GetRandFloat();
        *(GLfloat *)(puVar1 + uVar4 * 4) = GVar8;
      }
      break;
    case Double:
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        GVar2 = GetRandDouble();
        *(GLdouble *)(puVar1 + uVar4 * 8) = GVar2;
      }
      break;
    case Int:
      uVar5 = s_rand;
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        uVar7 = uVar5 + 1;
        if (0xf < uVar7) {
          uVar7 = 3;
        }
        s_rand = uVar7;
        *(uint *)(puVar1 + uVar4 * 4) = uVar5 - 8;
        uVar5 = uVar7;
      }
      break;
    case Uint:
      uVar5 = s_rand;
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        uVar7 = uVar5 + 1;
        if (0xf < uVar7) {
          uVar7 = 3;
        }
        s_rand = uVar7;
        *(uint *)(puVar1 + uVar4 * 4) = uVar5;
        uVar5 = uVar7;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<GLubyte> Type::GenerateDataPacked() const
{
	const GLuint basic_size = GetTypeSize(m_basic_type);
	const GLuint n_elements = m_n_columns * m_n_rows;
	const GLuint size		= basic_size * n_elements;

	std::vector<GLubyte> data;
	data.resize(size);

	GLvoid* ptr = (GLvoid*)&data[0];

	switch (m_basic_type)
	{
	case Double:
	{
		GLdouble* d_ptr = (GLdouble*)ptr;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			d_ptr[i] = GetRandDouble();
		}
	}
	break;
	case Float:
	{
		GLfloat* f_ptr = (GLfloat*)ptr;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			f_ptr[i] = GetRandFloat();
		}
	}
	break;
	case Int:
	{
		GLint* i_ptr = (GLint*)ptr;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			i_ptr[i] = GetRandInt();
		}
	}
	break;
	case Uint:
	{
		GLuint* ui_ptr = (GLuint*)ptr;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			ui_ptr[i] = GetRandUint();
		}
	}
	break;
	}

	return data;
}